

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edits.cpp
# Opt level: O1

void __thiscall icu_63::Edits::addUnchanged(Edits *this,int32_t unchangedLength)

{
  bool bVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  
  if ((unchangedLength != 0) && (this->errorCode_ < U_ILLEGAL_ARGUMENT_ERROR)) {
    if (unchangedLength < 0) {
      this->errorCode_ = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      lVar2 = (long)this->length;
      if (lVar2 < 1) {
        uVar3 = 0xffff;
      }
      else {
        uVar3 = (uint)this->array[lVar2 + -1];
      }
      iVar5 = unchangedLength;
      if (uVar3 < 0xfff) {
        iVar4 = 0xfff - uVar3;
        if (unchangedLength - iVar4 == 0 || unchangedLength < iVar4) {
          this->array[lVar2 + -1] = (short)uVar3 + (short)unchangedLength;
        }
        else {
          this->array[lVar2 + -1] = 0xfff;
          iVar5 = unchangedLength - iVar4;
        }
        if (unchangedLength <= iVar4) {
          return;
        }
      }
      iVar4 = iVar5;
      if (0xfff < iVar5) {
        do {
          append(this,0xfff);
          iVar5 = iVar4 + -0x1000;
          bVar1 = 0x1fff < iVar4;
          iVar4 = iVar5;
        } while (bVar1);
      }
      if (0 < iVar5) {
        append(this,iVar5 + -1);
        return;
      }
    }
  }
  return;
}

Assistant:

void Edits::addUnchanged(int32_t unchangedLength) {
    if(U_FAILURE(errorCode_) || unchangedLength == 0) { return; }
    if(unchangedLength < 0) {
        errorCode_ = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    // Merge into previous unchanged-text record, if any.
    int32_t last = lastUnit();
    if(last < MAX_UNCHANGED) {
        int32_t remaining = MAX_UNCHANGED - last;
        if (remaining >= unchangedLength) {
            setLastUnit(last + unchangedLength);
            return;
        }
        setLastUnit(MAX_UNCHANGED);
        unchangedLength -= remaining;
    }
    // Split large lengths into multiple units.
    while(unchangedLength >= MAX_UNCHANGED_LENGTH) {
        append(MAX_UNCHANGED);
        unchangedLength -= MAX_UNCHANGED_LENGTH;
    }
    // Write a small (remaining) length.
    if(unchangedLength > 0) {
        append(unchangedLength - 1);
    }
}